

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

int64_t calc_level_size(int64_t mind,int64_t maxd,int level,exr_tile_round_mode_t rounding)

{
  long lVar1;
  long lVar2;
  int64_t retsize;
  int64_t b;
  int64_t dsize;
  exr_tile_round_mode_t rounding_local;
  int level_local;
  int64_t maxd_local;
  int64_t mind_local;
  
  lVar1 = (maxd - mind) + 1;
  lVar2 = 1L << ((byte)level & 0x3f);
  retsize = lVar1 / lVar2;
  if ((rounding == EXR_TILE_ROUND_UP) && (retsize * lVar2 < lVar1)) {
    retsize = retsize + 1;
  }
  if (retsize < 1) {
    retsize = 1;
  }
  return retsize;
}

Assistant:

static int64_t
calc_level_size (
    int64_t mind, int64_t maxd, int level, exr_tile_round_mode_t rounding)
{
    int64_t dsize   = (int64_t) maxd - (int64_t) mind + 1;
    int64_t b       = ((int64_t) 1) << level;
    int64_t retsize = dsize / b;

    if (rounding == EXR_TILE_ROUND_UP && retsize * b < dsize) retsize += 1;

    if (retsize < 1) retsize = 1;
    return retsize;
}